

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprPointerLiteral * AllocateTypeStorage(ExpressionEvalContext *ctx,SynBase *source,TypeBase *type)

{
  uint uVar1;
  ExprPointerLiteral *pEVar2;
  long lVar3;
  ExprPointerLiteral **ppEVar4;
  Allocator *pAVar5;
  int iVar6;
  ExprPointerLiteral *in_RAX;
  TypeRef *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar8;
  char *msg;
  long lVar9;
  bool bVar10;
  uchar *ptr;
  
  if ((type == (TypeBase *)0x0) || (type->typeID != 0)) {
    bVar10 = (ctx->abandonedMemory).count != 0;
    if (bVar10) {
      lVar9 = 0;
      do {
        pEVar2 = (ctx->abandonedMemory).data[lVar9];
        lVar8 = (long)pEVar2->end - (long)pEVar2->ptr;
        lVar3 = type->size;
        if (lVar8 == lVar3) {
          pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
          (pEVar2->super_ExprBase).type = &pTVar7->super_TypeBase;
          memset(pEVar2->ptr,0,(ulong)(uint)type->size);
          uVar1 = (ctx->abandonedMemory).count;
          if (uVar1 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,
                          "T &SmallArray<ExprPointerLiteral *, 32>::back() [T = ExprPointerLiteral *, N = 32]"
                         );
          }
          if (uVar1 <= (uint)lVar9) {
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<ExprPointerLiteral *, 32>::operator[](unsigned int) [T = ExprPointerLiteral *, N = 32]"
                         );
          }
          ppEVar4 = (ctx->abandonedMemory).data;
          ppEVar4[lVar9] = ppEVar4[uVar1 - 1];
          (ctx->abandonedMemory).count = uVar1 - 1;
          in_RAX = pEVar2;
        }
        if (lVar8 == lVar3) break;
        lVar9 = lVar9 + 1;
        bVar10 = (uint)lVar9 < (ctx->abandonedMemory).count;
      } while (bVar10);
    }
    if (bVar10) {
      return in_RAX;
    }
    lVar9 = type->size;
    if ((long)(ulong)ctx->variableMemoryLimit < lVar9) {
      msg = "ERROR: single variable memory limit";
    }
    else {
      if ((long)(lVar9 + (ulong)ctx->totalMemory) <= (long)(ulong)ctx->totalMemoryLimit) {
        ctx->totalMemory = ctx->totalMemory + (int)lVar9;
        iVar6 = (*ctx->ctx->allocator->_vptr_Allocator[2])();
        ptr = (uchar *)CONCAT44(extraout_var,iVar6);
        memset(ptr,0,(ulong)(uint)type->size);
        pAVar5 = ctx->ctx->allocator;
        iVar6 = (*pAVar5->_vptr_Allocator[2])(pAVar5,0x40);
        pTVar7 = ExpressionContext::GetReferenceType(ctx->ctx,type);
        ExprPointerLiteral::ExprPointerLiteral
                  ((ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar6),source,
                   &pTVar7->super_TypeBase,ptr,ptr + type->size);
        return (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar6);
      }
      msg = "ERROR: total variable memory limit";
    }
    Report(ctx,msg);
  }
  return (ExprPointerLiteral *)0x0;
}

Assistant:

ExprPointerLiteral* AllocateTypeStorage(ExpressionEvalContext &ctx, SynBase *source, TypeBase *type)
{
	if(isType<TypeError>(type))
		return NULL;

	for(unsigned i = 0; i < ctx.abandonedMemory.size(); i++)
	{
		ExprPointerLiteral *ptr = ctx.abandonedMemory[i];

		if(ptr->end - ptr->ptr == type->size)
		{
			ptr->type = ctx.ctx.GetReferenceType(type);

			memset(ptr->ptr, 0, unsigned(type->size));

			ctx.abandonedMemory[i] = ctx.abandonedMemory.back();
			ctx.abandonedMemory.pop_back();

			return ptr;
		}
	}

	if(type->size > ctx.variableMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: single variable memory limit");

	if(ctx.totalMemory + type->size > ctx.totalMemoryLimit)
		return (ExprPointerLiteral*)Report(ctx, "ERROR: total variable memory limit");

	ctx.totalMemory += unsigned(type->size);

	unsigned char *memory = (unsigned char*)ctx.ctx.allocator->alloc(unsigned(type->size));

	memset(memory, 0, unsigned(type->size));

	return new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(source, ctx.ctx.GetReferenceType(type), memory, memory + type->size);
}